

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstatusbar.cpp
# Opt level: O0

void __thiscall QStatusBar::showMessage(QStatusBar *this,QString *message,int timeout)

{
  bool bVar1;
  QStatusBarPrivate *pQVar2;
  QTimer *this_00;
  int in_EDX;
  QString *in_RSI;
  QObject *in_RDI;
  long in_FS_OFFSET;
  offset_in_QTimer_to_subr unaff_retaddr;
  ConnectionType in_stack_00000020;
  QStatusBarPrivate *d;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  QString *in_stack_ffffffffffffff90;
  code *in_stack_ffffffffffffffb0;
  QObject *context;
  Connection local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  context = in_RDI;
  pQVar2 = d_func((QStatusBar *)0x6a3e43);
  if (in_EDX < 1) {
    if (pQVar2->timer != (QTimer *)0x0) {
      if (pQVar2->timer != (QTimer *)0x0) {
        (**(code **)(*(long *)pQVar2->timer + 0x20))();
      }
      pQVar2->timer = (QTimer *)0x0;
    }
  }
  else {
    if (pQVar2->timer == (QTimer *)0x0) {
      this_00 = (QTimer *)operator_new(0x10);
      QTimer::QTimer(this_00,in_RDI);
      pQVar2->timer = this_00;
      in_stack_ffffffffffffffb0 = QTimer::timeout;
      in_stack_ffffffffffffff88 = 0;
      QObject::connect<void(QTimer::*)(QTimer::QPrivateSignal),void(QStatusBar::*)()>
                ((Object *)clearMessage,unaff_retaddr,(ContextType *)context,
                 (offset_in_QStatusBar_to_subr *)in_RSI,in_stack_00000020);
      QMetaObject::Connection::~Connection(&local_10);
    }
    QTimer::start((int)pQVar2->timer);
  }
  bVar1 = ::operator==(in_stack_ffffffffffffff90,
                       (QString *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  if (!bVar1) {
    QString::operator=(&pQVar2->tempItem,in_RSI);
    hideOrShow((QStatusBar *)in_stack_ffffffffffffffb0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QStatusBar::showMessage(const QString &message, int timeout)
{
    Q_D(QStatusBar);

    if (timeout > 0) {
        if (!d->timer) {
            d->timer = new QTimer(this);
            connect(d->timer, &QTimer::timeout, this, &QStatusBar::clearMessage);
        }
        d->timer->start(timeout);
    } else if (d->timer) {
        delete d->timer;
        d->timer = nullptr;
    }
    if (d->tempItem == message)
        return;
    d->tempItem = message;

    hideOrShow();
}